

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O0

void copyFile(string *filepath,string *dirpath)

{
  dir_entry *pdVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  char *__s2;
  long lVar5;
  string *local_1c20;
  string *local_1be8;
  string *local_1b48;
  string *local_1ae0;
  string local_1ad0 [32];
  string local_1ab0 [36];
  int local_1a8c;
  dir_block *pdStack_1a88;
  int i;
  dir_block *q;
  File_Block *p;
  string filecontent;
  string local_1a58 [8];
  string filename;
  string local_1a38 [36];
  int local_1a14;
  string local_1a10 [4];
  int id3;
  int local_19ec;
  string local_19e8 [4];
  int id2;
  int local_19c4;
  string local_19c0 [4];
  int legal_layers2;
  int local_199c;
  string local_1998 [4];
  int layers2;
  string local_d18 [36];
  int local_cf4;
  string local_cf0 [4];
  int id1;
  int local_cd0;
  int legal_layers1;
  string local_cc0 [36];
  int local_c9c;
  string local_c98 [4];
  int layers1;
  string *local_18;
  string *dirpath_local;
  string *filepath_local;
  
  local_1ae0 = local_c98;
  local_18 = dirpath;
  dirpath_local = filepath;
  do {
    std::__cxx11::string::string(local_1ae0);
    local_1ae0 = local_1ae0 + 0x20;
  } while (local_1ae0 != (string *)&local_18);
  std::__cxx11::string::string(local_cc0,(string *)filepath);
  iVar2 = parsePath((string *)local_cc0,(string *)local_c98);
  std::__cxx11::string::~string(local_cc0);
  local_c9c = iVar2;
  std::__cxx11::string::string(local_cf0,(string *)filepath);
  iVar3 = getPathType((string *)local_cf0);
  iVar3 = doesExist((string *)local_c98,iVar2,iVar3 == 2);
  std::__cxx11::string::~string(local_cf0);
  iVar2 = local_c9c;
  local_cd0 = iVar3;
  if (local_c9c == iVar3) {
    std::__cxx11::string::string(local_d18,(string *)filepath);
    iVar3 = getPathType((string *)local_d18);
    iVar2 = getId((string *)local_c98,iVar2,iVar3 == 2);
    std::__cxx11::string::~string(local_d18);
    local_cf4 = iVar2;
    if (inodes[iVar2].i_mode == 1) {
      setColor(3);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)filepath);
      poVar4 = std::operator<<(poVar4," is not a file.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      setColor(2);
    }
    else {
      local_1b48 = local_1998;
      do {
        std::__cxx11::string::string(local_1b48);
        local_1b48 = local_1b48 + 0x20;
      } while (local_1b48 != local_d18);
      std::__cxx11::string::string(local_19c0,(string *)dirpath);
      iVar2 = parsePath((string *)local_19c0,(string *)local_1998);
      std::__cxx11::string::~string(local_19c0);
      local_199c = iVar2;
      std::__cxx11::string::string(local_19e8,(string *)dirpath);
      iVar3 = getPathType((string *)local_19e8);
      iVar3 = doesExist((string *)local_1998,iVar2,iVar3 == 2);
      std::__cxx11::string::~string(local_19e8);
      iVar2 = local_199c;
      local_19c4 = iVar3;
      if (local_199c == iVar3) {
        std::__cxx11::string::string(local_1a10,(string *)dirpath);
        iVar3 = getPathType((string *)local_1a10);
        iVar2 = getId((string *)local_1998,iVar2,iVar3 == 2);
        std::__cxx11::string::~string(local_1a10);
        iVar3 = local_c9c + -1;
        local_19ec = iVar2;
        std::__cxx11::string::string(local_1a38,(string *)filepath);
        iVar2 = getPathType((string *)local_1a38);
        iVar2 = getId((string *)local_c98,iVar3,iVar2 == 2);
        std::__cxx11::string::~string(local_1a38);
        local_1a14 = iVar2;
        if (inodes[local_19ec].i_mode == 2) {
          setColor(3);
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)dirpath);
          std::operator<<(poVar4," is not a folder.\n");
          setColor(2);
        }
        else if (local_19ec == iVar2) {
          setColor(3);
          poVar4 = std::operator<<((ostream *)&std::cout,"Invalid path.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          setColor(2);
        }
        else {
          std::__cxx11::string::string(local_1a58);
          std::__cxx11::string::string((string *)&p);
          q = (dir_block *)getAddressByLocation_File(inodes[local_cf4].i_blocks[0]);
          pdStack_1a88 = getAddressByLocation_Folder(inodes[local_1a14].i_blocks[0]);
          std::__cxx11::string::operator=((string *)&p,(char *)q);
          for (local_1a8c = 2; local_1a8c < 0x10; local_1a8c = local_1a8c + 1) {
            lVar5 = (long)local_1a8c;
            pdVar1 = pdStack_1a88->dirs;
            __s2 = (char *)std::__cxx11::string::c_str();
            iVar2 = strcmp(pdVar1[lVar5].name,__s2);
            if (iVar2 == 0) {
              std::__cxx11::string::operator=(local_1a58,pdStack_1a88->dirs[local_1a8c].name);
              break;
            }
          }
          iVar2 = local_19ec;
          std::__cxx11::string::string(local_1ab0,local_1a58);
          std::__cxx11::string::string(local_1ad0,(string *)&p);
          iVar2 = makeFileById(iVar2,(string *)local_1ab0,(string *)local_1ad0);
          std::__cxx11::string::~string(local_1ad0);
          std::__cxx11::string::~string(local_1ab0);
          if (iVar2 == 0) {
            poVar4 = std::operator<<((ostream *)&std::cout,"current folder is full!");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
          std::__cxx11::string::~string((string *)&p);
          std::__cxx11::string::~string(local_1a58);
        }
      }
      else {
        setColor(3);
        poVar4 = std::operator<<((ostream *)&std::cout,"Invalid path.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        setColor(2);
      }
      local_1be8 = local_d18;
      do {
        local_1be8 = local_1be8 + -0x20;
        std::__cxx11::string::~string(local_1be8);
      } while (local_1be8 != local_1998);
    }
  }
  else {
    setColor(3);
    poVar4 = std::operator<<((ostream *)&std::cout,"Invalid path.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_1c20 = (string *)&local_18;
  do {
    local_1c20 = local_1c20 + -0x20;
    std::__cxx11::string::~string(local_1c20);
  } while (local_1c20 != local_c98);
  return;
}

Assistant:

void copyFile(string filepath, string dirpath) {
    string names1[100];
    int layers1 = parsePath(filepath, names1);
    int legal_layers1 = doesExist(names1, layers1, getPathType(filepath) == RELATIVE_PATH);
    if (layers1 == legal_layers1) {
        int id1 = getId(names1, layers1, getPathType(filepath) == RELATIVE_PATH);
        if (inodes[id1].i_mode == A_FOLDER) {
            setColor(COLOR_ERR);
            cout << filepath << " is not a file." << endl;
            setColor(COLOR_ORIGIN);
        }
        else {
            string names2[100];
            int layers2 = parsePath(dirpath, names2);
            int legal_layers2 = doesExist(names2, layers2, getPathType(dirpath) == RELATIVE_PATH);
            if (layers2 == legal_layers2) {//dirpath合法
                int id2 = getId(names2, layers2, getPathType(dirpath) == RELATIVE_PATH);
                int id3 = getId(names1, layers1 - 1, getPathType(filepath) == RELATIVE_PATH);
                if (inodes[id2].i_mode == A_FILE) {
                    setColor(COLOR_ERR);
                    cout << dirpath << " is not a folder.\n";
                    setColor(COLOR_ORIGIN);
                }
                else if (id2 == id3) {//若是需拷贝文件所在的目录
                    setColor(COLOR_ERR);
                    cout << "Invalid path." << endl;
                    setColor(COLOR_ORIGIN);
                }
                else {//完全合法
                    string filename, filecontent;
                    File_Block *p = getAddressByLocation_File(inodes[id1].i_blocks[0]);
                    dir_block *q = getAddressByLocation_Folder(inodes[id3].i_blocks[0]);
                    filecontent = p->data;
                    for (int i = 2; i < 16; i++) {
                        if (strcmp(q->dirs[i].name, names1[layers1 - 1].c_str()) == 0) {
                            filename = q->dirs[i].name;
                            break;
                        }
                    }
                    if(makeFileById(id2, filename, filecontent) == 0){
                        cout << "current folder is full!" << endl;
                        return;
                    }
                }
            }
            else {
                setColor(COLOR_ERR);
                cout << "Invalid path." << endl;
                setColor(COLOR_ORIGIN);
            }
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << "Invalid path." << endl;

    }
}